

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_next.c
# Opt level: O0

int NeXTDecode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  long c;
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  byte *s_00;
  uint local_7c;
  long lStack_78;
  uint32_t imagewidth;
  tmsize_t op_offset;
  uint32_t grey;
  uint32_t npixels;
  tmsize_t off;
  tmsize_t n;
  tmsize_t scanline;
  uint8_t *row;
  tmsize_t cc;
  uchar *op;
  uchar *bp;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  row = (uint8_t *)occ;
  cc = (tmsize_t)buf;
  while (0 < (long)row) {
    *(undefined1 *)cc = 0xff;
    row = row + -1;
    cc = cc + 1;
  }
  op = tif->tif_rawcp;
  row = (uint8_t *)tif->tif_rawcc;
  c = tif->tif_scanlinesize;
  scanline = (tmsize_t)buf;
  tStack_28 = occ;
  if (occ % c == 0) {
    for (; 0 < (long)row && 0 < tStack_28; tStack_28 = tStack_28 - c) {
      s_00 = op + 1;
      off = (tmsize_t)*op;
      row = row + -1;
      if (off == 0) {
        if ((long)row < c) goto LAB_003ea6fc;
        _TIFFmemcpy((void *)scanline,s_00,c);
        op = s_00 + c;
        row = row + -c;
      }
      else if (off == 0x40) {
        if ((long)row < 4) {
LAB_003ea6fc:
          TIFFErrorExtR(tif,"NeXTDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
          return 0;
        }
        lVar4 = (long)(int)((uint)*s_00 * 0x100 + (uint)op[2]);
        lVar5 = (long)(int)((uint)op[3] * 0x100 + (uint)op[4]);
        if (((long)row < lVar5 + 4) || (c < lVar4 + lVar5)) goto LAB_003ea6fc;
        _TIFFmemcpy((void *)(scanline + lVar4),op + 5,lVar5);
        op = s_00 + lVar5 + 4;
        row = row + -(lVar5 + 4);
      }
      else {
        op_offset._4_4_ = 0;
        lStack_78 = 0;
        local_7c = (tif->tif_dir).td_imagewidth;
        if ((tif->tif_flags & 0x400) != 0) {
          local_7c = (tif->tif_dir).td_tilewidth;
        }
        cc = scanline;
        op = s_00;
        while( true ) {
          lVar4 = off >> 6;
          iVar2 = (int)lVar4;
          off = off & 0x3f;
          while( true ) {
            lVar5 = off + -1;
            bVar1 = false;
            if ((0 < off) && (bVar1 = false, op_offset._4_4_ < local_7c)) {
              bVar1 = lStack_78 < c;
            }
            if (!bVar1) break;
            uVar6 = op_offset._4_4_ + 1;
            uVar3 = op_offset._4_4_ & 3;
            op_offset._4_4_ = uVar6;
            off = lVar5;
            switch(uVar3) {
            case 0:
              *(char *)cc = (char)(iVar2 << 6);
              break;
            case 1:
              *(byte *)cc = *(byte *)cc | (byte)(iVar2 << 4);
              break;
            case 2:
              *(byte *)cc = *(byte *)cc | (byte)(iVar2 << 2);
              break;
            case 3:
              *(byte *)cc = *(byte *)cc | (byte)lVar4;
              lStack_78 = lStack_78 + 1;
              cc = cc + 1;
            }
          }
          if (local_7c <= op_offset._4_4_) break;
          if (c <= lStack_78) {
            TIFFErrorExtR(tif,"NeXTDecode","Invalid data for scanline %u",(ulong)tif->tif_row);
            return 0;
          }
          if (row == (uint8_t *)0x0) goto LAB_003ea6fc;
          off = (tmsize_t)*op;
          row = row + -1;
          op = op + 1;
        }
      }
      scanline = c + scanline;
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = (tmsize_t)row;
    tif_local._4_4_ = 1;
  }
  else {
    TIFFErrorExtR(tif,"NeXTDecode","Fractional scanlines cannot be read");
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

static int NeXTDecode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "NeXTDecode";
    unsigned char *bp, *op;
    tmsize_t cc;
    uint8_t *row;
    tmsize_t scanline, n;

    (void)s;
    /*
     * Each scanline is assumed to start off as all
     * white (we assume a PhotometricInterpretation
     * of ``min-is-black'').
     */
    for (op = (unsigned char *)buf, cc = occ; cc-- > 0;)
        *op++ = 0xff;

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    scanline = tif->tif_scanlinesize;
    if (occ % scanline)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    for (row = buf; cc > 0 && occ > 0; occ -= scanline, row += scanline)
    {
        n = *bp++;
        cc--;
        switch (n)
        {
            case LITERALROW:
                /*
                 * The entire scanline is given as literal values.
                 */
                if (cc < scanline)
                    goto bad;
                _TIFFmemcpy(row, bp, scanline);
                bp += scanline;
                cc -= scanline;
                break;
            case LITERALSPAN:
            {
                tmsize_t off;
                /*
                 * The scanline has a literal span that begins at some
                 * offset.
                 */
                if (cc < 4)
                    goto bad;
                off = (bp[0] * 256) + bp[1];
                n = (bp[2] * 256) + bp[3];
                if (cc < 4 + n || off + n > scanline)
                    goto bad;
                _TIFFmemcpy(row + off, bp + 4, n);
                bp += 4 + n;
                cc -= 4 + n;
                break;
            }
            default:
            {
                uint32_t npixels = 0, grey;
                tmsize_t op_offset = 0;
                uint32_t imagewidth = tif->tif_dir.td_imagewidth;
                if (isTiled(tif))
                    imagewidth = tif->tif_dir.td_tilewidth;

                /*
                 * The scanline is composed of a sequence of constant
                 * color ``runs''.  We shift into ``run mode'' and
                 * interpret bytes as codes of the form
                 * <color><npixels> until we've filled the scanline.
                 */
                op = row;
                for (;;)
                {
                    grey = (uint32_t)((n >> 6) & 0x3);
                    n &= 0x3f;
                    /*
                     * Ensure the run does not exceed the scanline
                     * bounds, potentially resulting in a security
                     * issue.
                     */
                    while (n-- > 0 && npixels < imagewidth &&
                           op_offset < scanline)
                        SETPIXEL(op, grey);
                    if (npixels >= imagewidth)
                        break;
                    if (op_offset >= scanline)
                    {
                        TIFFErrorExtR(tif, module,
                                      "Invalid data for scanline %" PRIu32,
                                      tif->tif_row);
                        return (0);
                    }
                    if (cc == 0)
                        goto bad;
                    n = *bp++;
                    cc--;
                }
                break;
            }
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
bad:
    TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                  tif->tif_row);
    return (0);
}